

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferPtr
xmlOutputBufferCreateIO
          (xmlOutputWriteCallback iowrite,xmlOutputCloseCallback ioclose,void *ioctx,
          xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr ret;
  xmlCharEncodingHandlerPtr encoder_local;
  void *ioctx_local;
  xmlOutputCloseCallback ioclose_local;
  xmlOutputWriteCallback iowrite_local;
  
  if (iowrite == (xmlOutputWriteCallback)0x0) {
    xmlCharEncCloseFunc(encoder);
    iowrite_local = (xmlOutputWriteCallback)0x0;
  }
  else {
    iowrite_local = (xmlOutputWriteCallback)xmlAllocOutputBuffer(encoder);
    if ((xmlOutputBufferPtr)iowrite_local != (xmlOutputBufferPtr)0x0) {
      ((xmlOutputBufferPtr)iowrite_local)->context = ioctx;
      ((xmlOutputBufferPtr)iowrite_local)->writecallback = iowrite;
      ((xmlOutputBufferPtr)iowrite_local)->closecallback = ioclose;
    }
  }
  return (xmlOutputBufferPtr)iowrite_local;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateIO(xmlOutputWriteCallback   iowrite,
	 xmlOutputCloseCallback  ioclose, void *ioctx,
	 xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (iowrite == NULL) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = (void *) ioctx;
	ret->writecallback = iowrite;
	ret->closecallback = ioclose;
    }

    return(ret);
}